

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int yaml_parser_load_document(yaml_parser_t *parser,yaml_event_t *first_event)

{
  yaml_document_t *pyVar1;
  int iVar2;
  undefined1 local_88 [8];
  yaml_event_t event;
  yaml_event_t *first_event_local;
  yaml_parser_t *parser_local;
  
  event.end_mark.column = (size_t)first_event;
  if (first_event->type != YAML_DOCUMENT_START_EVENT) {
    __assert_fail("first_event->type == YAML_DOCUMENT_START_EVENT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/loader.c"
                  ,0xa9,"int yaml_parser_load_document(yaml_parser_t *, yaml_event_t *)");
  }
  parser->document->version_directive = (first_event->data).document_start.version_directive;
  (parser->document->tag_directives).start = (first_event->data).document_start.tag_directives.start
  ;
  (parser->document->tag_directives).end = (first_event->data).document_start.tag_directives.end;
  parser->document->start_implicit = (first_event->data).document_start.implicit;
  pyVar1 = parser->document;
  (pyVar1->start_mark).index = (first_event->start_mark).index;
  (pyVar1->start_mark).line = (first_event->start_mark).line;
  (pyVar1->start_mark).column = (first_event->start_mark).column;
  iVar2 = yaml_parser_parse(parser,(yaml_event_t *)local_88);
  if (iVar2 == 0) {
    parser_local._4_4_ = 0;
  }
  else {
    iVar2 = yaml_parser_load_node(parser,(yaml_event_t *)local_88);
    if (iVar2 == 0) {
      parser_local._4_4_ = 0;
    }
    else {
      iVar2 = yaml_parser_parse(parser,(yaml_event_t *)local_88);
      if (iVar2 == 0) {
        parser_local._4_4_ = 0;
      }
      else {
        if (local_88._0_4_ != YAML_DOCUMENT_END_EVENT) {
          __assert_fail("event.type == YAML_DOCUMENT_END_EVENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/loader.c"
                        ,0xbb,"int yaml_parser_load_document(yaml_parser_t *, yaml_event_t *)");
        }
        parser->document->end_implicit = event.type;
        pyVar1 = parser->document;
        (pyVar1->end_mark).index = event.start_mark.column;
        (pyVar1->end_mark).line = event.end_mark.index;
        (pyVar1->end_mark).column = event.end_mark.line;
        parser_local._4_4_ = 1;
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_load_document(yaml_parser_t *parser, yaml_event_t *first_event)
{
    yaml_event_t event;

    assert(first_event->type == YAML_DOCUMENT_START_EVENT);
                        /* DOCUMENT-START is expected. */

    parser->document->version_directive
        = first_event->data.document_start.version_directive;
    parser->document->tag_directives.start
        = first_event->data.document_start.tag_directives.start;
    parser->document->tag_directives.end
        = first_event->data.document_start.tag_directives.end;
    parser->document->start_implicit
        = first_event->data.document_start.implicit;
    parser->document->start_mark = first_event->start_mark;

    if (!yaml_parser_parse(parser, &event)) return 0;

    if (!yaml_parser_load_node(parser, &event)) return 0;

    if (!yaml_parser_parse(parser, &event)) return 0;
    assert(event.type == YAML_DOCUMENT_END_EVENT);
                        /* DOCUMENT-END is expected. */

    parser->document->end_implicit = event.data.document_end.implicit;
    parser->document->end_mark = event.end_mark;

    return 1;
}